

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_attr_set_string(exr_context_t ctxt,int part_index,char *name,char *val)

{
  int iVar1;
  exr_result_t eVar2;
  char *d;
  exr_context_t in_RCX;
  char *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_t **in_stack_00000010;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  size_t bytes;
  int32_t in_stack_ffffffffffffffa4;
  _internal_exr_part *s;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  char *name_00;
  exr_attribute_list_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  name_00 = (char *)0x0;
  uVar3 = 0;
  if ((in_RDX == (char *)0x0) || (iVar1 = strcmp(in_RDX,"name"), iVar1 != 0)) {
    if (in_RDI == (_internal_exr_context *)0x0) {
      eVar2 = 2;
    }
    else {
      list = in_RDI;
      internal_exr_lock(in_RDI);
      if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
      }
      else {
        s = in_RDI->parts[(int)in_ESI];
        if ((in_RDX == (char *)0x0) || (iVar1 = strcmp(in_RDX,"type"), iVar1 != 0)) {
          if (in_RDI->mode == '\0') {
            internal_exr_unlock(in_RDI);
            eVar2 = (*in_RDI->standard_error)(in_RDI,8);
          }
          else if (in_RDI->mode == '\x03') {
            internal_exr_unlock(in_RDI);
            eVar2 = (*in_RDI->standard_error)(in_RDI,0x15);
          }
          else {
            eVar2 = exr_attr_list_find_by_name
                              (in_RCX,in_stack_ffffffffffffffd0,name_00,
                               (exr_attribute_t **)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
            if (in_RCX == (exr_const_context_t)0x0) {
              d = (char *)0x0;
            }
            else {
              d = (char *)strlen((char *)in_RCX);
            }
            if (d < (char *)0x80000000) {
              if (eVar2 == 0xf) {
                if (in_RDI->mode != '\x01') {
                  internal_exr_unlock(in_RDI);
                  return eVar2;
                }
                eVar2 = exr_attr_list_add((exr_context_t)
                                          CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),
                                          (exr_attribute_list_t *)list,
                                          (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                          (exr_attribute_type_t)((ulong)in_RDX >> 0x20),
                                          (int32_t)in_RDX,(uint8_t **)in_RCX,in_stack_00000010);
                if (eVar2 == 0) {
                  eVar2 = exr_attr_string_create_with_length
                                    ((exr_context_t)in_RDI,(exr_attr_string_t *)s,d,
                                     in_stack_ffffffffffffffa4);
                }
              }
              else if (eVar2 == 0) {
                if (*(int *)(name_00 + 0x14) != 0x13) {
                  internal_exr_unlock(in_RDI);
                  eVar2 = (*in_RDI->print_error)
                                    (in_RDI,0x10,
                                     "\'%s\' requested type \'string\', but attribute is type \'%s\'"
                                     ,in_RDX,*(undefined8 *)(name_00 + 8));
                  return eVar2;
                }
                if ((**(int **)(name_00 + 0x18) == (int)d) &&
                   (0 < *(int *)(*(long *)(name_00 + 0x18) + 4))) {
                  if (in_RCX != (exr_const_context_t)0x0) {
                    memcpy(*(void **)(*(long *)(name_00 + 0x18) + 8),in_RCX,(size_t)d);
                  }
                }
                else {
                  if (in_RDI->mode != '\x01') {
                    internal_exr_unlock(in_RDI);
                    eVar2 = (*in_RDI->print_error)
                                      (in_RDI,0x14,
                                       "Existing string \'%s\' has length %d, requested %d, unable to change"
                                       ,in_RDX,(ulong)**(uint **)(name_00 + 0x18),
                                       (ulong)d & 0xffffffff);
                    return eVar2;
                  }
                  eVar2 = exr_attr_string_set_with_length
                                    ((exr_context_t)in_RDI,(exr_attr_string_t *)s,d,
                                     in_stack_ffffffffffffffa4);
                }
              }
              internal_exr_unlock(in_RDI);
            }
            else {
              internal_exr_unlock(in_RDI);
              eVar2 = (*in_RDI->print_error)
                                (in_RDI,3,"String too large to store (%lu bytes) into \'%s\'",d,
                                 in_RDX);
            }
          }
        }
        else {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->print_error)
                            (in_RDI,3,
                             "Part type attribute must be implicitly only when adding a part");
        }
      }
    }
  }
  else {
    eVar2 = exr_set_name(in_RCX,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),name_00);
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_string (
    exr_context_t ctxt, int part_index, const char* name, const char* val)
{
    size_t           bytes;
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    if (name && !strcmp (name, EXR_REQ_NAME_STR))
        return exr_set_name (ctxt, part_index, name);

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (name && !strcmp (name, EXR_REQ_TYPE_STR))
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Part type attribute must be implicitly only when adding a part"));

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    bytes = val ? strlen (val) : 0;

    if (bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into '%s'",
            (uint64_t) bytes,
            name));

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_STRING, 0, NULL, &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_create_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'string', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            if (val)
                memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string '%s' has length %d, requested %d, unable to change",
                name,
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}